

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

void __thiscall
CVmPackGroup::CVmPackGroup
          (CVmPackGroup *this,CVmPackGroup *parent,wchar_t open_paren,CVmPackPos *pos,CVmPackType *t
          )

{
  CVmDataSource *pCVar1;
  int iVar2;
  wchar_t wVar3;
  undefined4 extraout_var;
  
  this->parent = parent;
  (this->start).p.p_ = (pos->p).p_;
  (this->start).len = pos->len;
  (this->start).idx = pos->idx;
  pCVar1 = parent->ds;
  this->ds = pCVar1;
  iVar2 = (*pCVar1->_vptr_CVmDataSource[7])();
  this->stream_ofs = CONCAT44(extraout_var,iVar2);
  this->cur_iter = 1;
  this->big_endian = t->big_endian;
  this->tilde = t->tilde;
  this->pct = t->pct;
  this->num_iters = t->count;
  this->up_to_iters = t->up_to_count;
  if (open_paren == L'(') {
    wVar3 = L')';
  }
  else if (open_paren == L'[') {
    wVar3 = L']';
  }
  else {
    wVar3 = L'}';
    if (open_paren != L'{') {
      wVar3 = L'\0';
    }
  }
  this->close_paren = wVar3;
  return;
}

Assistant:

CVmPackGroup(CVmPackGroup *parent, wchar_t open_paren,
                 CVmPackPos *pos, const CVmPackType *t)
        : parent(parent), start(pos)
    {
        ds = parent->ds;
        stream_ofs = ds->get_pos();
        cur_iter = 1;
        big_endian = t->big_endian;
        tilde = t->tilde;
        pct = t->pct;
        num_iters = t->count;
        up_to_iters = t->up_to_count;
        close_paren = (open_paren == '(' ? ')' :
                       open_paren == '[' ? ']' :
                       open_paren == '{' ? '}' : 0);
    }